

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

value * eval::func_eval(func *func,vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args,
                       context *c)

{
  _func_value_ptr_vector<parser::thing_ptr,_std::allocator<parser::thing_ptr>_>_context_ptr *p_Var1;
  pointer pptVar2;
  expression *thing;
  pointer pptVar3;
  mapped_type pvVar4;
  vector<parser::thing_*,_std::allocator<parser::thing_*>_> vVar5;
  value *pvVar6;
  mapped_type *ppvVar7;
  int i;
  ulong uVar8;
  int i_2;
  __node_base *p_Var9;
  vector<eval::value_*,_std::allocator<eval::value_*>_> e_args;
  context c2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
  i_1;
  _Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_> local_48;
  
  if (func->is_std_fn == true) {
    p_Var1 = func->f;
    std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::vector
              ((vector<parser::thing_*,_std::allocator<parser::thing_*>_> *)&local_48,args);
    vVar5.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    vVar5.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    vVar5.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    pvVar6 = (*p_Var1)(vVar5,(context *)&local_48);
    std::_Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>::~_Vector_base(&local_48);
  }
  else {
    e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar8 = 1;
        pptVar2 = (args->super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(args->
                              super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar2 >> 3);
        uVar8 = uVar8 + 1) {
      c2._M_h._M_buckets = (__buckets_ptr)eval(pptVar2[uVar8],c);
      std::vector<eval::value*,std::allocator<eval::value*>>::emplace_back<eval::value*>
                ((vector<eval::value*,std::allocator<eval::value*>> *)&e_args,(value **)&c2);
    }
    c2._M_h._M_buckets = &c2._M_h._M_single_bucket;
    c2._M_h._M_bucket_count = 1;
    c2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    c2._M_h._M_element_count = 0;
    c2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    c2._M_h._M_rehash_policy._M_next_resize = 0;
    c2._M_h._M_single_bucket = (__node_base_ptr)0x0;
    stdlib::init_stdlib(&c2);
    p_Var9 = &(c->_M_h)._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
      ::pair(&i_1,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
                   *)(p_Var9 + 1));
      pvVar6 = i_1.second;
      if ((i_1.second)->ty == FUNC) {
        ppvVar7 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&c2,&i_1.first);
        *ppvVar7 = pvVar6;
      }
      std::__cxx11::string::~string((string *)&i_1);
    }
    thing = func->body;
    for (uVar8 = 0;
        pptVar3 = (func->arg_list->
                  super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(func->arg_list->
                              super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar3 >> 3);
        uVar8 = uVar8 + 1) {
      pvVar4 = e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      std::__cxx11::string::string((string *)&i_1,(string *)&pptVar3[uVar8]->content);
      ppvVar7 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&c2,&i_1.first);
      *ppvVar7 = pvVar4;
      std::__cxx11::string::~string((string *)&i_1);
    }
    pvVar6 = eval(&thing->super_thing,&c2);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&c2._M_h);
    std::_Vector_base<eval::value_*,_std::allocator<eval::value_*>_>::~_Vector_base
              (&e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>);
  }
  return pvVar6;
}

Assistant:

eval::value *eval::func_eval(eval::func *func, std::vector<parser::thing *> args, context &c) {

  if (func->is_std())
    return func->f(args, c);

  std::vector<eval::value *> e_args;
  for (int i = 1; i < args.size(); i++) {
    e_args.push_back(eval::eval(args[i], c));
  }

  context c2;
  stdlib::init_stdlib(c2);

  for (auto i : c) {
    if ((i.second)->get_type()==eval::type::FUNC)
      c2[i.first] = i.second;
  }

  parser::expression *e = func->get_body();
  for (int i = 0; i < func->arg_list->size(); i++) {

    c2[((*(func->arg_list))[i])->get_content()] = e_args[i];

  }

  eval::value *val = eval::eval(e, c2);

  return val;

}